

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O0

char __thiscall dna_string::operator[](dna_string *this,uint64_t i)

{
  int iVar1;
  uint uVar2;
  ulong *puVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint64_t b;
  __uint128_t *chars;
  uint64_t block_off;
  uint64_t block_number;
  uint64_t superblock_off;
  uint64_t superblock_number;
  uint64_t i_local;
  dna_string *this_local;
  
  block_off._0_1_ = (byte)i & 0x7f;
  puVar3 = (ulong *)(this->data + ((i & 0xffffffff) >> 7) * 0x40 + (i >> 0x20) * 0x80000000);
  bVar6 = (byte)block_off ^ 0x7f;
  uVar4 = (uint)(puVar3[4] >> (bVar6 & 0x3f)) | (uint)(puVar3[5] << 0x40 - (bVar6 & 0x3f));
  if ((bVar6 & 0x40) != 0) {
    uVar4 = (uint)(puVar3[5] >> (bVar6 & 0x3f));
  }
  uVar5 = (uint)(puVar3[2] >> (bVar6 & 0x3f)) | (uint)(puVar3[3] << 0x40 - (bVar6 & 0x3f));
  if ((bVar6 & 0x40) != 0) {
    uVar5 = (uint)(puVar3[3] >> (bVar6 & 0x3f));
  }
  uVar2 = (uint)(*puVar3 >> (bVar6 & 0x3f)) | (uint)(puVar3[1] << 0x40 - (bVar6 & 0x3f));
  if ((bVar6 & 0x40) != 0) {
    uVar2 = (uint)(puVar3[1] >> (bVar6 & 0x3f));
  }
  iVar1 = (uVar2 & 1) + (uVar5 & 1) * 2 + (uVar4 & 1) * 4;
  return (iVar1 == 0) * 'A' + (iVar1 == 1) * 'C' + (iVar1 == 2) * 'G' + (iVar1 == 3) * 'T' +
         (iVar1 == 4) * this->TERM;
}

Assistant:

char operator[](uint64_t i){

		assert(i<n);

		uint64_t superblock_number = i / SUPERBLOCK_SIZE;
		uint64_t superblock_off = i % SUPERBLOCK_SIZE;
		uint64_t block_number = superblock_off / BLOCK_SIZE;
		uint64_t block_off = superblock_off % BLOCK_SIZE;

		//chars[0..3] contains 1st, 2nd, 3rd least significant bits of the BLOCK_SIZE characters
		__uint128_t* chars = (__uint128_t*)(data + superblock_number*BYTES_PER_SUPERBLOCK + block_number*BYTES_PER_BLOCK);

		uint64_t b =	((chars[0]>>(BLOCK_SIZE-(block_off+1)))&0x1) +
						(((chars[1]>>(BLOCK_SIZE-(block_off+1)))&0x1)<<1) +
						(((chars[2]>>(BLOCK_SIZE-(block_off+1)))&0x1)<<2);

		return 	(b == 0)*'A' +
				(b == 1)*'C' +
				(b == 2)*'G' +
				(b == 3)*'T' +
				(b == 4)*TERM;

	}